

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_from.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformFrom
          (Transformer *this,optional_ptr<duckdb_libpgquery::PGList,_true> root)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  anon_union_8_3_7edaf945_for_data aVar2;
  undefined8 uVar3;
  anon_union_8_3_7edaf945_for_data aVar4;
  pointer pJVar5;
  ParserOptions *in_RDX;
  idx_t *piVar6;
  optional_ptr<duckdb_libpgquery::PGNode,_true> n;
  optional_ptr<duckdb_libpgquery::PGNode,_true> n_1;
  anon_union_8_3_7edaf945_for_data local_70;
  undefined1 local_68 [48];
  size_type local_38;
  
  if (in_RDX == (ParserOptions *)0x0) {
    local_70.ptr_value = operator_new(0x68);
    *(TableReferenceType *)((long)local_70.ptr_value + 8) = EMPTY_FROM;
    (((string *)((long)local_70.ptr_value + 0x10))->_M_dataplus)._M_p =
         (pointer)((long)local_70.ptr_value + 0x20);
    *(size_type *)((long)local_70.ptr_value + 0x18) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)local_70.ptr_value + 0x20))->_M_local_buf[0] = '\0';
    (((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
     ((long)local_70.ptr_value + 0x30))->
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
    super__Head_base<0UL,_duckdb::SampleOptions_*,_false> =
         (_Head_base<0UL,_duckdb::SampleOptions_*,_false>)0x0;
    ((optional_idx *)((long)local_70.ptr_value + 0x38))->index = 0xffffffffffffffff;
    (((shared_ptr<duckdb::ExternalDependency,_true> *)((long)local_70.ptr_value + 0x40))->internal).
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_70.ptr_value + 0x48))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       *)((long)local_70.ptr_value + 0x50))->
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)((long)local_70.ptr_value + 0x58) = (pointer)0x0;
    *(pointer *)((long)local_70.ptr_value + 0x60) = (pointer)0x0;
    *(undefined ***)local_70.ptr_value = &PTR__TableRef_0243c108;
  }
  else {
    local_68._8_8_ = in_RDX;
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)(local_68 + 8));
    if (*(int *)(local_68._8_8_ + 4) < 2) {
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGList,_true> *)(local_68 + 8));
      local_70 = **(anon_union_8_3_7edaf945_for_data **)(local_68._8_8_ + 8);
      optional_ptr<duckdb_libpgquery::PGNode,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGNode,_true> *)&local_70);
      TransformTableRefNode(this,(PGNode *)root.ptr);
      return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>)this;
    }
    local_68._24_8_ = this;
    aVar4.ptr_value = operator_new(0xc0);
    *(TableReferenceType *)((long)aVar4.ptr_value + 8) = JOIN;
    (((string *)((long)aVar4.ptr_value + 0x10))->_M_dataplus)._M_p =
         (pointer)((long)aVar4.ptr_value + 0x20);
    *(size_type *)((long)aVar4.ptr_value + 0x18) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)aVar4.ptr_value + 0x20))->_M_local_buf[0] = '\0';
    (((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
     ((long)aVar4.ptr_value + 0x30))->
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_> =
         (_Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>)0x0
    ;
    ((optional_idx *)((long)aVar4.ptr_value + 0x38))->index = 0xffffffffffffffff;
    (((shared_ptr<duckdb::ExternalDependency,_true> *)((long)aVar4.ptr_value + 0x40))->internal).
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)aVar4.ptr_value + 0x48))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       *)((long)aVar4.ptr_value + 0x50))->
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)((long)aVar4.ptr_value + 0x58) = (pointer)0x0;
    *(pointer *)((long)aVar4.ptr_value + 0x60) = (pointer)0x0;
    local_68._32_8_ = &PTR__JoinRef_0243c210;
    *(undefined ***)aVar4.ptr_value = &PTR__JoinRef_0243c210;
    ((TableRef *)((long)aVar4.ptr_value + 0x68))->_vptr_TableRef = (_func_int **)0x0;
    *(undefined8 *)&((TableRef *)((long)aVar4.ptr_value + 0x68))->type = 0;
    (((TableRef *)((long)aVar4.ptr_value + 0x68))->alias)._M_dataplus._M_p = (pointer)0x0;
    *(undefined2 *)&(((TableRef *)((long)aVar4.ptr_value + 0x68))->alias)._M_string_length = 0x203;
    (((TableRef *)((long)aVar4.ptr_value + 0x68))->alias).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((TableRef *)((long)aVar4.ptr_value + 0x68))->alias).field_2 + 8) = 0;
    (((TableRef *)((long)aVar4.ptr_value + 0x68))->sample).
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
    super__Head_base<0UL,_duckdb::SampleOptions_*,_false> =
         (_Head_base<0UL,_duckdb::SampleOptions_*,_false>)0x0;
    (((TableRef *)((long)aVar4.ptr_value + 0x68))->query_location).index = 0;
    (((TableRef *)((long)aVar4.ptr_value + 0x68))->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (((TableRef *)((long)aVar4.ptr_value + 0x68))->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined1 *)
     &(((TableRef *)((long)aVar4.ptr_value + 0x68))->column_name_alias).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    local_70.ptr_value = aVar4.ptr_value;
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)(local_68 + 8));
    piVar6 = *(idx_t **)(local_68._8_8_ + 8);
    this = (Transformer *)local_68._24_8_;
    if (piVar6 != (idx_t *)0x0) {
      do {
        local_68._16_8_ = *piVar6;
        optional_ptr<duckdb_libpgquery::PGNode,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGNode,_true> *)(local_68 + 0x10));
        TransformTableRefNode((Transformer *)local_68,(PGNode *)root.ptr);
        uVar3 = local_68._0_8_;
        aVar2 = local_70;
        if (((TableRef *)((long)aVar4.ptr_value + 0x68))->_vptr_TableRef == (_func_int **)0x0) {
          local_68._0_8_ = (Transformer *)0x0;
          ((TableRef *)((long)aVar4.ptr_value + 0x68))->_vptr_TableRef = (_func_int **)uVar3;
        }
        else if (*(long *)&((TableRef *)((long)aVar4.ptr_value + 0x68))->type == 0) {
          local_68._0_8_ = (Transformer *)0x0;
          *(undefined8 *)&((TableRef *)((long)aVar4.ptr_value + 0x68))->type = uVar3;
        }
        else {
          local_70.ptr_value = (void *)0x0;
          local_70.ptr_value = operator_new(0xc0);
          *(TableReferenceType *)((long)local_70.ptr_value + 8) = JOIN;
          (((string *)((long)local_70.ptr_value + 0x10))->_M_dataplus)._M_p =
               (pointer)((long)local_70.ptr_value + 0x20);
          *(size_type *)((long)local_70.ptr_value + 0x18) = 0;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)local_70.ptr_value + 0x20))->_M_local_buf[0] = '\0';
          (((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
           ((long)local_70.ptr_value + 0x30))->
          super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)._M_t
          .super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
               = (_Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                  )0x0;
          ((optional_idx *)((long)local_70.ptr_value + 0x38))->index = 0xffffffffffffffff;
          (((shared_ptr<duckdb::ExternalDependency,_true> *)((long)local_70.ptr_value + 0x40))->
          internal).super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_70.ptr_value + 0x48))->_M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)((long)local_70.ptr_value + 0x50))->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(pointer *)((long)local_70.ptr_value + 0x58) = (pointer)0x0;
          *(pointer *)((long)local_70.ptr_value + 0x60) = (pointer)0x0;
          *(undefined8 *)local_70.ptr_value = local_68._32_8_;
          ((TableRef *)((long)local_70.ptr_value + 0x68))->_vptr_TableRef = (_func_int **)0x0;
          *(undefined8 *)&((TableRef *)((long)local_70.ptr_value + 0x68))->type = 0;
          (((TableRef *)((long)local_70.ptr_value + 0x68))->alias)._M_dataplus._M_p = (pointer)0x0;
          *(undefined2 *)&(((TableRef *)((long)local_70.ptr_value + 0x68))->alias)._M_string_length
               = 0x203;
          (((TableRef *)((long)local_70.ptr_value + 0x68))->alias).field_2._M_allocated_capacity = 0
          ;
          *(undefined8 *)
           ((long)&(((TableRef *)((long)local_70.ptr_value + 0x68))->alias).field_2 + 8) = 0;
          (((TableRef *)((long)local_70.ptr_value + 0x68))->sample).
          super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
          super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
          .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0
          ;
          (((TableRef *)((long)local_70.ptr_value + 0x68))->query_location).index = 0;
          (((TableRef *)((long)local_70.ptr_value + 0x68))->external_dependency).internal.
          super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (((TableRef *)((long)local_70.ptr_value + 0x68))->external_dependency).internal.
          super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(undefined1 *)
           &(((TableRef *)((long)local_70.ptr_value + 0x68))->column_name_alias).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = 0;
          pJVar5 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::
                   operator->((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>
                               *)&local_70);
          _Var1._M_head_impl =
               (pJVar5->left).
               super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
               super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
               super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
          (pJVar5->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
          _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
          super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)aVar2;
          if (_Var1._M_head_impl != (TableRef *)0x0) {
            (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
          }
          pJVar5 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::
                   operator->((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>
                               *)&local_70);
          uVar3 = local_68._0_8_;
          local_68._0_8_ = (Transformer *)0x0;
          _Var1._M_head_impl =
               (pJVar5->right).
               super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
               super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
               super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
          (pJVar5->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
          ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t
          .super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
          super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar3;
          aVar4 = local_70;
          if (_Var1._M_head_impl != (TableRef *)0x0) {
            (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
            aVar4 = local_70;
          }
        }
        StackCheck((Transformer *)(local_68 + 0x28),(idx_t)root.ptr);
        ((_Hash_node_base *)(local_68._40_8_ + 200))->_M_nxt =
             (_Hash_node_base *)
             ((long)((_Hash_node_base *)(local_68._40_8_ + 200))->_M_nxt - local_38);
        piVar6 = (idx_t *)piVar6[1];
        this = (Transformer *)local_68._24_8_;
      } while (piVar6 != (idx_t *)0x0);
    }
  }
  ((TableRef *)this)->_vptr_TableRef = (_func_int **)local_70;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> Transformer::TransformFrom(optional_ptr<duckdb_libpgquery::PGList> root) {
	if (!root) {
		return make_uniq<EmptyTableRef>();
	}

	if (root->length > 1) {
		// Cross Product
		auto result = make_uniq<JoinRef>(JoinRefType::CROSS);
		JoinRef *cur_root = result.get();
		idx_t list_size = 0;
		for (auto node = root->head; node != nullptr; node = node->next) {
			auto n = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
			unique_ptr<TableRef> next = TransformTableRefNode(*n);
			if (!cur_root->left) {
				cur_root->left = std::move(next);
			} else if (!cur_root->right) {
				cur_root->right = std::move(next);
			} else {
				auto old_res = std::move(result);
				result = make_uniq<JoinRef>(JoinRefType::CROSS);
				result->left = std::move(old_res);
				result->right = std::move(next);
				cur_root = result.get();
			}
			list_size++;
			StackCheck(list_size);
		}
		return std::move(result);
	}

	auto n = PGPointerCast<duckdb_libpgquery::PGNode>(root->head->data.ptr_value);
	return TransformTableRefNode(*n);
}